

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall SQCompilation::CodegenVisitor::visitUnExpr(CodegenVisitor *this,UnExpr *unary)

{
  TreeOp TVar1;
  CodegenVisitor *visitor;
  CodegenVisitor *in_RSI;
  UnExpr *unaff_retaddr;
  undefined4 in_stack_00000008;
  SQOpcode in_stack_0000000c;
  CodegenVisitor *in_stack_00000010;
  Expr *in_stack_ffffffffffffffe8;
  
  maybeAddInExprLine(in_RSI,in_stack_ffffffffffffffe8);
  TVar1 = Node::op((Node *)in_RSI);
  visitor = (CodegenVisitor *)(ulong)(TVar1 - TO_NOT);
  switch(visitor) {
  case (CodegenVisitor *)0x0:
    emitUnaryOp(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    break;
  case (CodegenVisitor *)0x1:
    emitUnaryOp(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    break;
  case (CodegenVisitor *)0x2:
    emitUnaryOp(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    break;
  case (CodegenVisitor *)0x3:
    emitUnaryOp(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    break;
  case (CodegenVisitor *)0x4:
    emitUnaryOp(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    break;
  case (CodegenVisitor *)0x5:
    emitUnaryOp(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    break;
  case (CodegenVisitor *)0x6:
    UnExpr::argument((UnExpr *)in_RSI);
    Node::visit<SQCompilation::CodegenVisitor>((Node *)in_RSI,visitor);
    break;
  case (CodegenVisitor *)0x7:
    emitDelete(in_stack_00000010,(UnExpr *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  }
  return;
}

Assistant:

void CodegenVisitor::visitUnExpr(UnExpr *unary) {
    maybeAddInExprLine(unary);

    switch (unary->op())
    {
    case TO_NEG: emitUnaryOp(_OP_NEG, unary); break;
    case TO_NOT: emitUnaryOp(_OP_NOT, unary); break;
    case TO_BNOT:emitUnaryOp(_OP_BWNOT, unary); break;
    case TO_TYPEOF: emitUnaryOp(_OP_TYPEOF, unary); break;
    case TO_RESUME: emitUnaryOp(_OP_RESUME, unary); break;
    case TO_CLONE: emitUnaryOp(_OP_CLONE, unary); break;
    case TO_PAREN: unary->argument()->visit(this); break;
    case TO_DELETE: emitDelete(unary);
        break;
    default:
        break;
    }
}